

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_chain_operation<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
               (Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
                *m)

{
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  
  build_simple_chain_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>
            ();
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
            (&columns,m);
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
  ::add_to(&m->matrix_,3,5);
  local_38 = 3;
  uStack_34 = 2;
  uStack_30 = 4;
  uStack_2c = 1;
  local_28 = 0x400000005;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(columns.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 5),&local_38);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
            (&columns,m);
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
  ::add_to(&m->matrix_,4,5);
  local_38 = 3;
  uStack_34 = 3;
  uStack_30 = 4;
  uStack_2c = 2;
  local_28 = 0x400000005;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(columns.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 5),&local_38);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
            (&columns,m);
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
  ::multiply_target_and_add_to<int>(m,5,3,3);
  local_38 = 3;
  uStack_34 = 1;
  uStack_30 = 4;
  uStack_2c = 2;
  local_28 = 0x400000005;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(columns.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 3),&local_38);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
            (&columns,m);
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
  ::multiply_source_and_add_to<int>(m,4,5,4);
  local_38 = 3;
  uStack_34 = 3;
  uStack_30 = 4;
  uStack_2c = 4;
  local_28 = 0x100000005;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(columns.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 4),&local_38);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
            (&columns,m);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_chain_operation(Matrix& m) {
  auto columns = build_simple_chain_matrix<typename Matrix::Column>();

  test_content_equality(columns, m);

  m.add_to(3, 5);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[5] = {4, 5};
  } else {
    columns[5] = {{3, 2}, {4, 1}, {5, 4}};
  }
  test_content_equality(columns, m);

  m.add_to(4, 5);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[5] = {3, 5};
  } else {
    columns[5] = {{3, 3}, {4, 2}, {5, 4}};
  }
  test_content_equality(columns, m);

  m.multiply_target_and_add_to(5, 3, 3);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[3] = {5};
  } else {
    columns[3] = {{3, 1}, {4, 2}, {5, 4}};
  }
  test_content_equality(columns, m);

  m.multiply_source_and_add_to(4, 5, 4);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[4] = {3, 4};
  } else {
    columns[4] = {{3, 3}, {4, 4}, {5, 1}};
  }
  test_content_equality(columns, m);
}